

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O1

int __thiscall
SID::clock_resample_fast(SID *this,cycle_count *delta_t,short *buf,int n,int interleave)

{
  short *psVar1;
  int iVar2;
  long lVar3;
  short sVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int local_54;
  
  iVar5 = 0;
  do {
    uVar6 = this->cycles_per_sample + this->sample_offset;
    iVar9 = (int)uVar6 >> 0x10;
    iVar2 = 2;
    iVar8 = local_54;
    if ((iVar9 <= *delta_t) && (iVar2 = 1, iVar8 = iVar5, iVar5 < n)) {
      iVar8 = iVar9;
      if (0 < iVar9) {
        do {
          clock(this);
          iVar2 = (this->extfilt).Vo;
          lVar3 = (long)iVar2;
          sVar4 = (short)(uint)((ulong)(lVar3 * 0x2e8ba2e9) >> 0x21) - (short)(iVar2 >> 0x1f);
          if (lVar3 < -0x5800a) {
            sVar4 = -0x8000;
          }
          if (0x57fff < lVar3) {
            sVar4 = 0x7fff;
          }
          psVar1 = this->sample;
          iVar2 = this->sample_index;
          psVar1[(long)iVar2 + 0x4000] = sVar4;
          psVar1[iVar2] = sVar4;
          this->sample_index = iVar2 + 1U & 0x3fff;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      *delta_t = *delta_t - iVar9;
      uVar6 = uVar6 & 0xffff;
      this->sample_offset = uVar6;
      lVar3 = (long)this->fir_N;
      iVar2 = 0;
      iVar8 = 0;
      if (0 < lVar3) {
        lVar7 = 0;
        iVar8 = 0;
        do {
          iVar8 = iVar8 + (int)this->fir[this->fir_N * ((int)(uVar6 * this->fir_RES) >> 0x10) +
                                         lVar7] *
                          (int)this->sample[(long)this->sample_index + ((lVar7 + 0x4000) - lVar3)];
          lVar7 = lVar7 + 1;
        } while (lVar3 != lVar7);
        iVar8 = iVar8 >> 0xf;
      }
      if (iVar8 < -0x7fff) {
        iVar8 = -0x8000;
      }
      sVar4 = (short)iVar8;
      if (0x7ffe < iVar8) {
        sVar4 = 0x7fff;
      }
      buf[iVar5 * interleave] = sVar4;
      iVar8 = local_54;
      iVar5 = iVar5 + 1;
    }
    local_54 = iVar8;
  } while (iVar2 == 0);
  if (iVar2 == 2) {
    iVar8 = *delta_t;
    if (0 < iVar8) {
      iVar2 = 0;
      do {
        clock(this);
        iVar8 = (this->extfilt).Vo;
        lVar3 = (long)iVar8;
        sVar4 = (short)(uint)((ulong)(lVar3 * 0x2e8ba2e9) >> 0x21) - (short)(iVar8 >> 0x1f);
        if (lVar3 < -0x5800a) {
          sVar4 = -0x8000;
        }
        if (0x57fff < lVar3) {
          sVar4 = 0x7fff;
        }
        psVar1 = this->sample;
        iVar8 = this->sample_index;
        psVar1[(long)iVar8 + 0x4000] = sVar4;
        psVar1[iVar8] = sVar4;
        this->sample_index = iVar8 + 1U & 0x3fff;
        iVar2 = iVar2 + 1;
        iVar8 = *delta_t;
      } while (iVar2 < iVar8);
    }
    this->sample_offset = this->sample_offset + iVar8 * -0x10000;
    *delta_t = 0;
    local_54 = iVar5;
  }
  return local_54;
}

Assistant:

RESID_INLINE
int SID::clock_resample_fast(cycle_count& delta_t, short* buf, int n,
			     int interleave)
{
  int s = 0;

  for (;;) {
    cycle_count next_sample_offset = sample_offset + cycles_per_sample;
    cycle_count delta_t_sample = next_sample_offset >> FIXP_SHIFT;
    if (delta_t_sample > delta_t) {
      break;
    }
    if (s >= n) {
      return s;
    }
    for (int i = 0; i < delta_t_sample; i++) {
      clock();
      sample[sample_index] = sample[sample_index + RINGSIZE] = output();
      ++sample_index;
      sample_index &= 0x3fff;
    }
    delta_t -= delta_t_sample;
    sample_offset = next_sample_offset & FIXP_MASK;

    int fir_offset = sample_offset*fir_RES >> FIXP_SHIFT;
    short* fir_start = fir + fir_offset*fir_N;
    short* sample_start = sample + sample_index - fir_N + RINGSIZE;

    // Convolution with filter impulse response.
    int v = 0;
    for (int j = 0; j < fir_N; j++) {
      v += sample_start[j]*fir_start[j];
    }

    v >>= FIR_SHIFT;

    // Saturated arithmetics to guard against 16 bit sample overflow.
    const int half = 1 << 15;
    if (v >= half) {
      v = half - 1;
    }
    else if (v < -half) {
      v = -half;
    }

    buf[s++*interleave] = v;
  }

  for (int i = 0; i < delta_t; i++) {
    clock();
    sample[sample_index] = sample[sample_index + RINGSIZE] = output();
    ++sample_index;
    sample_index &= 0x3fff;
  }
  sample_offset -= delta_t << FIXP_SHIFT;
  delta_t = 0;
  return s;
}